

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloccommon.c
# Opt level: O0

int av1_get_MBs(int width,int height)

{
  int mb_rows;
  int mb_cols;
  int mi_rows;
  int mi_cols;
  int aligned_height;
  int aligned_width;
  int height_local;
  int width_local;
  
  return (((int)(height + 7U & 0xfffffff8) >> 2) + 2 >> 2) *
         (((int)(width + 7U & 0xfffffff8) >> 2) + 2 >> 2);
}

Assistant:

int av1_get_MBs(int width, int height) {
  const int aligned_width = ALIGN_POWER_OF_TWO(width, 3);
  const int aligned_height = ALIGN_POWER_OF_TWO(height, 3);
  const int mi_cols = aligned_width >> MI_SIZE_LOG2;
  const int mi_rows = aligned_height >> MI_SIZE_LOG2;

  const int mb_cols = ROUND_POWER_OF_TWO(mi_cols, 2);
  const int mb_rows = ROUND_POWER_OF_TWO(mi_rows, 2);
  return mb_rows * mb_cols;
}